

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int handle_handshake_record
              (ptls_t *tls,
              _func_int_ptls_t_ptr_ptls_message_emitter_t_ptr_ptls_iovec_t_int_ptls_handshake_properties_t_ptr
              *cb,ptls_message_emitter_t *emitter,st_ptls_record_t *rec,
              ptls_handshake_properties_t *properties)

{
  uint32_t uVar1;
  int iVar2;
  ulong len;
  size_t size;
  ptls_iovec_t pVar3;
  size_t new_size;
  size_t mess_len;
  uint8_t *src_end;
  uint8_t *src;
  int ret;
  ptls_handshake_properties_t *properties_local;
  st_ptls_record_t *rec_local;
  ptls_message_emitter_t *emitter_local;
  _func_int_ptls_t_ptr_ptls_message_emitter_t_ptr_ptls_iovec_t_int_ptls_handshake_properties_t_ptr
  *cb_local;
  ptls_t *tls_local;
  
  if (rec->type != '\x16') {
    return 0x32;
  }
  if ((tls->recvbuf).mess.base == (uint8_t *)0x0) {
    src_end = rec->fragment;
    mess_len = (size_t)(src_end + rec->length);
  }
  else {
    iVar2 = message_buffer_is_overflow(tls->ctx,(tls->recvbuf).mess.off + rec->length);
    if (iVar2 != 0) {
      return 0x28;
    }
    iVar2 = ptls_buffer_reserve(&(tls->recvbuf).mess,rec->length);
    if (iVar2 != 0) {
      return iVar2;
    }
    memcpy((tls->recvbuf).mess.base + (tls->recvbuf).mess.off,rec->fragment,rec->length);
    (tls->recvbuf).mess.off = rec->length + (tls->recvbuf).mess.off;
    src_end = (tls->recvbuf).mess.base;
    mess_len = (size_t)(src_end + (tls->recvbuf).mess.off);
  }
  src._4_4_ = 0x202;
  for (; 3 < (long)(mess_len - (long)src_end); src_end = src_end + len) {
    uVar1 = ntoh24(src_end + 1);
    len = (ulong)(uVar1 + 4);
    if ((long)(mess_len - (long)src_end) < (long)(int)(uVar1 + 4)) break;
    pVar3 = ptls_iovec_init(src_end,len);
    src._4_4_ = (*cb)(tls,emitter,pVar3,(uint)(mess_len - (long)src_end == len),properties);
    if ((src._4_4_ != 0) && (src._4_4_ != 0x202)) {
      ptls_buffer_dispose(&(tls->recvbuf).mess);
      return src._4_4_;
    }
  }
  if (src_end == (uint8_t *)mess_len) {
    ptls_buffer_dispose(&(tls->recvbuf).mess);
  }
  else {
    size = mess_len - (long)src_end;
    iVar2 = message_buffer_is_overflow(tls->ctx,size);
    if (iVar2 != 0) {
      return 0x28;
    }
    if ((tls->recvbuf).mess.base == (uint8_t *)0x0) {
      ptls_buffer_init(&(tls->recvbuf).mess,"",0);
      iVar2 = ptls_buffer_reserve(&(tls->recvbuf).mess,size);
      if (iVar2 != 0) {
        return iVar2;
      }
      memcpy((tls->recvbuf).mess.base,src_end,size);
    }
    else {
      memmove((tls->recvbuf).mess.base,src_end,size);
    }
    (tls->recvbuf).mess.off = size;
    src._4_4_ = 0x202;
  }
  return src._4_4_;
}

Assistant:

static int handle_handshake_record(ptls_t *tls,
                                   int (*cb)(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_iovec_t message,
                                             int is_end_of_record, ptls_handshake_properties_t *properties),
                                   ptls_message_emitter_t *emitter, struct st_ptls_record_t *rec,
                                   ptls_handshake_properties_t *properties)
{
    int ret;

    /* handshake */
    if (rec->type != PTLS_CONTENT_TYPE_HANDSHAKE)
        return PTLS_ALERT_DECODE_ERROR;

    /* flatten the unhandled messages */
    const uint8_t *src, *src_end;
    if (tls->recvbuf.mess.base == NULL) {
        src = rec->fragment;
        src_end = src + rec->length;
    } else {
        if (message_buffer_is_overflow(tls->ctx, tls->recvbuf.mess.off + rec->length))
            return PTLS_ALERT_HANDSHAKE_FAILURE;
        if ((ret = ptls_buffer_reserve(&tls->recvbuf.mess, rec->length)) != 0)
            return ret;
        memcpy(tls->recvbuf.mess.base + tls->recvbuf.mess.off, rec->fragment, rec->length);
        tls->recvbuf.mess.off += rec->length;
        src = tls->recvbuf.mess.base;
        src_end = src + tls->recvbuf.mess.off;
    }

    /* handle the messages */
    ret = PTLS_ERROR_IN_PROGRESS;
    while (src_end - src >= 4) {
        size_t mess_len = 4 + ntoh24(src + 1);
        if (src_end - src < (int)mess_len)
            break;
        ret = cb(tls, emitter, ptls_iovec_init(src, mess_len), src_end - src == mess_len, properties);
        switch (ret) {
        case 0:
        case PTLS_ERROR_IN_PROGRESS:
            break;
        default:
            ptls_buffer_dispose(&tls->recvbuf.mess);
            return ret;
        }
        src += mess_len;
    }

    /* keep last partial message in buffer */
    if (src != src_end) {
        size_t new_size = src_end - src;
        if (message_buffer_is_overflow(tls->ctx, new_size))
            return PTLS_ALERT_HANDSHAKE_FAILURE;
        if (tls->recvbuf.mess.base == NULL) {
            ptls_buffer_init(&tls->recvbuf.mess, "", 0);
            if ((ret = ptls_buffer_reserve(&tls->recvbuf.mess, new_size)) != 0)
                return ret;
            memcpy(tls->recvbuf.mess.base, src, new_size);
        } else {
            memmove(tls->recvbuf.mess.base, src, new_size);
        }
        tls->recvbuf.mess.off = new_size;
        ret = PTLS_ERROR_IN_PROGRESS;
    } else {
        ptls_buffer_dispose(&tls->recvbuf.mess);
    }

    return ret;
}